

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void>_>
         *this)

{
  Precision PVar1;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  size_t sVar2;
  pointer pVVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  CommandLine *this_01;
  TestContext *this_02;
  TestLog *this_03;
  MessageBuilder *pMVar8;
  Statement *pSVar9;
  reference ppFVar10;
  ShaderExecutor *pSVar11;
  Variable<tcu::Matrix<float,_2,_3>_> *pVVar12;
  Variable<vkt::shaderexecutor::Void> *pVVar13;
  FloatFormat *pFVar14;
  IVal *this_04;
  IVal *pIVar15;
  reference pvVar16;
  IVal *value;
  reference value_00;
  FloatFormat *fmt_00;
  deUint32 in_stack_ffffffffffffe8c8;
  pointer local_1508;
  allocator<char> local_14c1;
  string local_14c0;
  undefined4 local_14a0;
  allocator<char> local_1499;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1498;
  string local_1478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1458;
  MessageBuilder local_1438;
  MessageBuilder local_12b8;
  int local_1134;
  MessageBuilder local_1130;
  string local_fb0;
  string local_f90;
  string local_f70;
  string local_f50;
  string local_f30;
  string local_f10;
  string local_ef0;
  string local_ed0;
  string local_eb0;
  string local_e90;
  string local_e70;
  string local_e50;
  string local_e30;
  string local_e10;
  undefined1 local_df0 [8];
  MessageBuilder builder;
  string local_c68;
  IVal local_c48;
  allocator<char> local_bb1;
  string local_bb0;
  undefined1 local_b88 [8];
  EvalContext ctx;
  IVal local_b40;
  IVal local_ab0;
  IVal local_a20;
  IVal local_990;
  Void local_8f9;
  undefined1 local_8f8 [7];
  IVal reference1_1;
  IVal reference0_1;
  pointer pVStack_860;
  bool result;
  size_t valueNdx;
  undefined1 local_850 [7];
  IVal reference1;
  IVal reference0;
  undefined1 local_7b8 [6];
  IVal in3;
  IVal in2;
  IVal in1;
  IVal in0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_690;
  MessageBuilder local_670;
  _Self local_4f0;
  _Self local_4e8;
  const_iterator it;
  FuncSet funcs;
  ostringstream oss;
  MessageBuilder local_338;
  reference local_1b8;
  void *outputArr [2];
  void *inputArr [4];
  TestLog *testLog;
  ResultCollector status;
  Environment env;
  int numErrors;
  int maxMsgs;
  FloatFormat highpFmt;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void>_>
  outputs;
  size_t numValues;
  int outCount;
  int inCount;
  FloatFormat *fmt;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void>_>
  *this_local;
  
  this_00 = this->m_samplings;
  fmt_00 = &(this->m_caseCtx).floatFormat;
  PVar1 = (this->m_caseCtx).precision;
  sVar2 = (this->m_caseCtx).numRandoms;
  inputs.in3.
  super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  this_01 = tcu::TestContext::getCommandLine((this->m_caseCtx).testContext);
  iVar6 = tcu::CommandLine::getBaseSeed(this_01);
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,2,3>,tcu::Matrix<float,2,3>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            ((Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)&fmt,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)fmt_00,(FloatFormat *)(ulong)PVar1,(Precision)sVar2,(ulong)(iVar6 + 0xdeadbeef),
             in_stack_ffffffffffffe8c8);
  iVar6 = numInputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,2,3>,tcu::Matrix<float,2,3>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
                    ();
  iVar7 = numOutputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,2,3>,vkt::shaderexecutor::Void>>
                    ();
  if (iVar6 < 1) {
    local_1508 = (pointer)0x1;
  }
  else {
    local_1508 = (pointer)std::
                          vector<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                          ::size((vector<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                                  *)&fmt);
  }
  outputs.out1.
  super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_1508;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void>_>::
  Outputs((Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void>_>
           *)&highpFmt.m_maxValue,(size_t)local_1508);
  highpFmt._24_8_ = (this->m_caseCtx).highpFormat.m_maxValue;
  numErrors = (this->m_caseCtx).highpFormat.m_minExp;
  unique0x1000107b = (this->m_caseCtx).highpFormat.m_maxExp;
  highpFmt.m_minExp = (this->m_caseCtx).highpFormat.m_fractionBits;
  highpFmt.m_maxExp = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  highpFmt.m_fractionBits = (this->m_caseCtx).highpFormat.m_hasInf;
  highpFmt.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasNaN;
  highpFmt._16_8_ = *(undefined8 *)&(this->m_caseCtx).highpFormat.m_exactPrecision;
  env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 100;
  env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
  Environment::Environment((Environment *)((long)&status.m_message.field_2 + 8));
  tcu::ResultCollector::ResultCollector((ResultCollector *)&testLog);
  this_02 = Context::getTestContext((this->super_TestInstance).m_context);
  this_03 = tcu::TestContext::getLog(this_02);
  outputArr[1] = std::vector<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>::
                 front((vector<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                        *)&fmt);
  std::vector<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>::front
            ((vector<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_> *)
             &inputs.in0.
              super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>::front
            ((vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_> *)
             &inputs.in1.
              super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>::front
            ((vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_> *)
             &inputs.in2.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_1b8 = std::vector<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>::
              front((vector<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_> *)
                    &highpFmt.m_maxValue);
  outputArr[0] = std::vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                 ::front((vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          *)&outputs.out0.
                             super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  tcu::TestLog::operator<<(&local_338,this_03,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar8 = tcu::MessageBuilder::operator<<(&local_338,(char (*) [12])"Statement: ");
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&this->m_stmt);
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_338);
  std::__cxx11::ostringstream::ostringstream
            ((ostringstream *)&funcs._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  set<const_vkt::shaderexecutor::FuncBase_*,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::set((set<const_vkt::shaderexecutor::FuncBase_*,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
         *)&it);
  pSVar9 = de::SharedPtr<const_vkt::shaderexecutor::Statement>::operator->
                     (&(this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>);
  Statement::getUsedFuncs
            (pSVar9,(set<const_vkt::shaderexecutor::FuncBase_*,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
                     *)&it);
  local_4e8._M_node =
       (_Base_ptr)
       std::
       set<const_vkt::shaderexecutor::FuncBase_*,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
       ::begin((set<const_vkt::shaderexecutor::FuncBase_*,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
                *)&it);
  while( true ) {
    local_4f0._M_node =
         (_Base_ptr)
         std::
         set<const_vkt::shaderexecutor::FuncBase_*,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
         ::end((set<const_vkt::shaderexecutor::FuncBase_*,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
                *)&it);
    bVar4 = std::operator!=(&local_4e8,&local_4f0);
    if (!bVar4) break;
    ppFVar10 = std::_Rb_tree_const_iterator<const_vkt::shaderexecutor::FuncBase_*>::operator*
                         (&local_4e8);
    FuncBase::printDefinition
              (*ppFVar10,(ostream *)&funcs._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::_Rb_tree_const_iterator<const_vkt::shaderexecutor::FuncBase_*>::operator++(&local_4e8);
  }
  bVar4 = std::
          set<const_vkt::shaderexecutor::FuncBase_*,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
          ::empty((set<const_vkt::shaderexecutor::FuncBase_*,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
                   *)&it);
  if (!bVar4) {
    tcu::TestLog::operator<<(&local_670,this_03,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar8 = tcu::MessageBuilder::operator<<(&local_670,(char (*) [24])"Reference definitions:\n");
    std::__cxx11::ostringstream::str();
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_690);
    tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&local_690);
    tcu::MessageBuilder::~MessageBuilder(&local_670);
  }
  std::
  set<const_vkt::shaderexecutor::FuncBase_*,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~set((set<const_vkt::shaderexecutor::FuncBase_*,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
          *)&it);
  std::__cxx11::ostringstream::~ostringstream
            ((ostringstream *)&funcs._M_t._M_impl.super__Rb_tree_header._M_node_count);
  switch(iVar6) {
  case 4:
  case 3:
  case 2:
  case 1:
  default:
    pSVar11 = de::details::
              UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
              ::operator->(&(this->m_executor).
                            super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
                          );
    pVVar3 = outputs.out1.
             super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pIVar15 = (IVal *)&local_1b8;
    ::vk::Handle<(vk::HandleType)22>::Handle
              ((Handle<(vk::HandleType)22> *)&in0.m_data.m_data[2].m_data[1].m_hi,0);
    (*pSVar11->_vptr_ShaderExecutor[2])(pSVar11,(ulong)pVVar3 & 0xffffffff,outputArr + 1);
    tcu::Matrix<tcu::Interval,_2,_3>::Matrix
              ((Matrix<tcu::Interval,_2,_3> *)&in1.m_data.m_data[2].m_data[1].m_hi);
    tcu::Matrix<tcu::Interval,_2,_3>::Matrix((Matrix<tcu::Interval,_2,_3> *)local_7b8);
    Void::Void((Void *)((long)&reference0.m_data.m_data[2].m_data[1].m_hi + 7));
    Void::Void((Void *)((long)&reference0.m_data.m_data[2].m_data[1].m_hi + 6));
    tcu::Matrix<tcu::Interval,_2,_3>::Matrix((Matrix<tcu::Interval,_2,_3> *)local_850);
    Void::Void((Void *)((long)&valueNdx + 7));
    pVVar12 = de::SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>::
              operator*((SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>
                         *)&this->m_variables);
    Environment::bind<tcu::Matrix<float,2,3>>
              ((Environment *)((long)&status.m_message.field_2 + 8),pVVar12,
               (IVal *)&in1.m_data.m_data[2].m_data[1].m_hi);
    pVVar12 = de::SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>::
              operator*(&(this->m_variables).in1.
                         super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>
                       );
    Environment::bind<tcu::Matrix<float,2,3>>
              ((Environment *)((long)&status.m_message.field_2 + 8),pVVar12,(IVal *)local_7b8);
    pVVar13 = de::SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>::
              operator*(&(this->m_variables).in2.
                         super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>
                       );
    Environment::bind<vkt::shaderexecutor::Void>
              ((Environment *)((long)&status.m_message.field_2 + 8),pVVar13,
               (IVal *)((long)&reference0.m_data.m_data[2].m_data[1].m_hi + 7));
    pVVar13 = de::SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>::
              operator*(&(this->m_variables).in3.
                         super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>
                       );
    Environment::bind<vkt::shaderexecutor::Void>
              ((Environment *)((long)&status.m_message.field_2 + 8),pVVar13,
               (IVal *)((long)&reference0.m_data.m_data[2].m_data[1].m_hi + 6));
    pVVar12 = de::SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>::
              operator*(&(this->m_variables).out0.
                         super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>
                       );
    Environment::bind<tcu::Matrix<float,2,3>>
              ((Environment *)((long)&status.m_message.field_2 + 8),pVVar12,(IVal *)local_850);
    pVVar13 = de::SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>::
              operator*(&(this->m_variables).out1.
                         super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>
                       );
    Environment::bind<vkt::shaderexecutor::Void>
              ((Environment *)((long)&status.m_message.field_2 + 8),pVVar13,
               (IVal *)((long)&valueNdx + 7));
    tcu::Matrix<tcu::Interval,_2,_3>::~Matrix((Matrix<tcu::Interval,_2,_3> *)local_850);
    tcu::Matrix<tcu::Interval,_2,_3>::~Matrix((Matrix<tcu::Interval,_2,_3> *)local_7b8);
    tcu::Matrix<tcu::Interval,_2,_3>::~Matrix
              ((Matrix<tcu::Interval,_2,_3> *)&in1.m_data.m_data[2].m_data[1].m_hi);
    pVStack_860 = (pointer)0x0;
  }
  do {
    if (outputs.out1.
        super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage <= pVStack_860) {
      if (100 < (int)env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count) {
        tcu::TestLog::operator<<(&local_1130,this_03,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar8 = tcu::MessageBuilder::operator<<(&local_1130,(char (*) [10])"(Skipped ");
        local_1134 = (int)env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count + -100;
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_1134);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [12])" messages.)");
        tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_1130);
      }
      if ((int)env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        tcu::TestLog::operator<<(&local_12b8,this_03,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar8 = tcu::MessageBuilder::operator<<(&local_12b8,(char (*) [5])"All ");
        pMVar8 = tcu::MessageBuilder::operator<<
                           (pMVar8,(unsigned_long *)
                                   &outputs.out1.
                                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [16])" inputs passed.");
        tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_12b8);
      }
      else {
        tcu::TestLog::operator<<(&local_1438,this_03,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar8 = tcu::MessageBuilder::operator<<
                           (&local_1438,
                            (int *)&env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x12f5e0e);
        pMVar8 = tcu::MessageBuilder::operator<<
                           (pMVar8,(unsigned_long *)
                                   &outputs.out1.
                                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [16])" inputs failed.");
        tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_1438);
      }
      if ((int)env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c0,"Pass",&local_14c1)
        ;
        tcu::TestStatus::pass(__return_storage_ptr__,&local_14c0);
        std::__cxx11::string::~string((string *)&local_14c0);
        std::allocator<char>::~allocator(&local_14c1);
      }
      else {
        de::toString<int>(&local_1478,
                          (int *)&env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1498," test failed. Check log for the details",&local_1499);
        std::operator+(&local_1458,&local_1478,&local_1498);
        tcu::TestStatus::fail(__return_storage_ptr__,&local_1458);
        std::__cxx11::string::~string((string *)&local_1458);
        std::__cxx11::string::~string((string *)&local_1498);
        std::allocator<char>::~allocator(&local_1499);
        std::__cxx11::string::~string((string *)&local_1478);
      }
      local_14a0 = 1;
      tcu::ResultCollector::~ResultCollector((ResultCollector *)&testLog);
      Environment::~Environment((Environment *)((long)&status.m_message.field_2 + 8));
      Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void>_>::
      ~Outputs((Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void>_>
                *)&highpFmt.m_maxValue);
      Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
      ::~Inputs((Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
                 *)&fmt);
      return __return_storage_ptr__;
    }
    bVar4 = true;
    tcu::Matrix<tcu::Interval,_2,_3>::Matrix((Matrix<tcu::Interval,_2,_3> *)local_8f8);
    Void::Void(&local_8f9);
    pFVar14 = (FloatFormat *)
              std::vector<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>::
              operator[]((vector<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                          *)&fmt,(size_type)pVStack_860);
    round<tcu::Matrix<float,2,3>>
              (&local_a20,(shaderexecutor *)fmt_00,pFVar14,(Matrix<float,_2,_3> *)pIVar15);
    convert<tcu::Matrix<float,2,3>>
              (&local_990,(shaderexecutor *)fmt_00,(FloatFormat *)&local_a20,pIVar15);
    pVVar12 = de::SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>::
              operator*((SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>
                         *)&this->m_variables);
    this_04 = Environment::lookup<tcu::Matrix<float,2,3>>
                        ((Environment *)((long)&status.m_message.field_2 + 8),pVVar12);
    tcu::Matrix<tcu::Interval,_2,_3>::operator=(this_04,&local_990);
    tcu::Matrix<tcu::Interval,_2,_3>::~Matrix(&local_990);
    tcu::Matrix<tcu::Interval,_2,_3>::~Matrix(&local_a20);
    pFVar14 = (FloatFormat *)
              std::vector<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>::
              operator[]((vector<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                          *)&inputs.in0.
                             super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (size_type)pVStack_860);
    round<tcu::Matrix<float,2,3>>
              (&local_b40,(shaderexecutor *)fmt_00,pFVar14,(Matrix<float,_2,_3> *)pIVar15);
    convert<tcu::Matrix<float,2,3>>
              (&local_ab0,(shaderexecutor *)fmt_00,(FloatFormat *)&local_b40,pIVar15);
    pVVar12 = de::SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>::
              operator*(&(this->m_variables).in1.
                         super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>
                       );
    pIVar15 = Environment::lookup<tcu::Matrix<float,2,3>>
                        ((Environment *)((long)&status.m_message.field_2 + 8),pVVar12);
    tcu::Matrix<tcu::Interval,_2,_3>::operator=(pIVar15,&local_ab0);
    tcu::Matrix<tcu::Interval,_2,_3>::~Matrix(&local_ab0);
    tcu::Matrix<tcu::Interval,_2,_3>::~Matrix(&local_b40);
    pvVar16 = std::vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>::
              operator[]((vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          *)&inputs.in1.
                             super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (size_type)pVStack_860);
    round<vkt::shaderexecutor::Void>(fmt_00,pvVar16);
    convert<vkt::shaderexecutor::Void>(fmt_00,(IVal *)&ctx.field_0x3e);
    pVVar13 = de::SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>::
              operator*(&(this->m_variables).in2.
                         super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>
                       );
    Environment::lookup<vkt::shaderexecutor::Void>
              ((Environment *)((long)&status.m_message.field_2 + 8),pVVar13);
    pvVar16 = std::vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>::
              operator[]((vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          *)&inputs.in2.
                             super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (size_type)pVStack_860);
    round<vkt::shaderexecutor::Void>(fmt_00,pvVar16);
    convert<vkt::shaderexecutor::Void>(fmt_00,(IVal *)((long)&ctx.callDepth + 2));
    pVVar13 = de::SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>::
              operator*(&(this->m_variables).in3.
                         super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>
                       );
    Environment::lookup<vkt::shaderexecutor::Void>
              ((Environment *)((long)&status.m_message.field_2 + 8),pVVar13);
    pIVar15 = (IVal *)((long)&status.m_message.field_2 + 8);
    EvalContext::EvalContext
              ((EvalContext *)local_b88,fmt_00,(this->m_caseCtx).precision,(Environment *)pIVar15,0)
    ;
    pSVar9 = de::SharedPtr<const_vkt::shaderexecutor::Statement>::operator->
                       (&(this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>);
    Statement::execute(pSVar9,(EvalContext *)local_b88);
    if (iVar7 == 1) {
LAB_01048538:
      pVVar12 = de::SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>::
                operator*(&(this->m_variables).out0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>
                         );
      pFVar14 = (FloatFormat *)
                Environment::lookup<tcu::Matrix<float,2,3>>
                          ((Environment *)((long)&status.m_message.field_2 + 8),pVVar12);
      convert<tcu::Matrix<float,2,3>>(&local_c48,(shaderexecutor *)&numErrors,pFVar14,pIVar15);
      tcu::Matrix<tcu::Interval,_2,_3>::operator=
                ((Matrix<tcu::Interval,_2,_3> *)local_8f8,&local_c48);
      tcu::Matrix<tcu::Interval,_2,_3>::~Matrix(&local_c48);
      value_00 = std::vector<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>::
                 operator[]((vector<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                             *)&highpFmt.m_maxValue,(size_type)pVStack_860);
      bVar5 = contains<tcu::Matrix<float,2,3>>((IVal *)local_8f8,value_00);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c68,"Shader output 0 is outside acceptable range",
                 (allocator<char> *)&builder.field_0x17f);
      bVar5 = tcu::ResultCollector::check((ResultCollector *)&testLog,bVar5,&local_c68);
      std::__cxx11::string::~string((string *)&local_c68);
      std::allocator<char>::~allocator((allocator<char> *)&builder.field_0x17f);
      if (((bVar5 ^ 0xffU) & 1) != 0) {
        bVar4 = false;
      }
    }
    else if (iVar7 == 2) {
      pVVar13 = de::SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>::
                operator*(&(this->m_variables).out1.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>
                         );
      value = Environment::lookup<vkt::shaderexecutor::Void>
                        ((Environment *)((long)&status.m_message.field_2 + 8),pVVar13);
      convert<vkt::shaderexecutor::Void>((FloatFormat *)&numErrors,value);
      pvVar16 = std::vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>::
                operator[]((vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                            *)&outputs.out0.
                               super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (size_type)pVStack_860);
      bVar4 = contains<vkt::shaderexecutor::Void>(&local_8f9,pvVar16);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_bb0,"Shader output 1 is outside acceptable range",&local_bb1);
      bVar4 = tcu::ResultCollector::check((ResultCollector *)&testLog,bVar4,&local_bb0);
      std::__cxx11::string::~string((string *)&local_bb0);
      std::allocator<char>::~allocator(&local_bb1);
      bVar4 = ((bVar4 ^ 0xffU) & 1) == 0;
      goto LAB_01048538;
    }
    if ((!bVar4) &&
       (env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
             (int)env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count + 1,
       (int)env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count < 0x65)) {
      tcu::TestLog::message((MessageBuilder *)local_df0,this_03);
      pMVar8 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_df0,(char (*) [7])"Failed");
      tcu::MessageBuilder::operator<<(pMVar8,(char (*) [10])" sample:\n");
      if (0 < iVar6) {
        pMVar8 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_df0,(char (*) [2])0x12f6f82);
        pVVar12 = de::SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>::
                  operator->((SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>
                              *)&this->m_variables);
        Variable<tcu::Matrix<float,2,3>>::getName_abi_cxx11_(&local_e10,pVVar12);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_e10);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [4])0x136d034);
        pFVar14 = (FloatFormat *)
                  std::vector<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                  ::operator[]((vector<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                                *)&fmt,(size_type)pVStack_860);
        valueToString<tcu::Matrix<float,2,3>>
                  (&local_e30,(shaderexecutor *)&numErrors,pFVar14,(Matrix<float,_2,_3> *)pIVar15);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_e30);
        tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x1387264);
        std::__cxx11::string::~string((string *)&local_e30);
        std::__cxx11::string::~string((string *)&local_e10);
      }
      if (1 < iVar6) {
        pMVar8 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_df0,(char (*) [2])0x12f6f82);
        pVVar12 = de::SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>::
                  operator->(&(this->m_variables).in1.
                              super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>
                            );
        Variable<tcu::Matrix<float,2,3>>::getName_abi_cxx11_(&local_e50,pVVar12);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_e50);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [4])0x136d034);
        pFVar14 = (FloatFormat *)
                  std::vector<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                  ::operator[]((vector<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                                *)&inputs.in0.
                                   super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (size_type)pVStack_860);
        valueToString<tcu::Matrix<float,2,3>>
                  (&local_e70,(shaderexecutor *)&numErrors,pFVar14,(Matrix<float,_2,_3> *)pIVar15);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_e70);
        tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x1387264);
        std::__cxx11::string::~string((string *)&local_e70);
        std::__cxx11::string::~string((string *)&local_e50);
      }
      if (2 < iVar6) {
        pMVar8 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_df0,(char (*) [2])0x12f6f82);
        pVVar13 = de::SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>::
                  operator->(&(this->m_variables).in2.
                              super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>
                            );
        Variable<vkt::shaderexecutor::Void>::getName_abi_cxx11_(&local_e90,pVVar13);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_e90);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [4])0x136d034);
        pvVar16 = std::vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                  ::operator[]((vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                                *)&inputs.in1.
                                   super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (size_type)pVStack_860);
        valueToString<vkt::shaderexecutor::Void>(&local_eb0,(FloatFormat *)&numErrors,pvVar16);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_eb0);
        tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x1387264);
        std::__cxx11::string::~string((string *)&local_eb0);
        std::__cxx11::string::~string((string *)&local_e90);
      }
      if (3 < iVar6) {
        pMVar8 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_df0,(char (*) [2])0x12f6f82);
        pVVar13 = de::SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>::
                  operator->(&(this->m_variables).in3.
                              super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>
                            );
        Variable<vkt::shaderexecutor::Void>::getName_abi_cxx11_(&local_ed0,pVVar13);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_ed0);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [4])0x136d034);
        pvVar16 = std::vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                  ::operator[]((vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                                *)&inputs.in2.
                                   super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (size_type)pVStack_860);
        valueToString<vkt::shaderexecutor::Void>(&local_ef0,(FloatFormat *)&numErrors,pvVar16);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_ef0);
        tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x1387264);
        std::__cxx11::string::~string((string *)&local_ef0);
        std::__cxx11::string::~string((string *)&local_ed0);
      }
      if (0 < iVar7) {
        pMVar8 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_df0,(char (*) [2])0x12f6f82);
        pVVar12 = de::SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>::
                  operator->(&(this->m_variables).out0.
                              super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>
                            );
        Variable<tcu::Matrix<float,2,3>>::getName_abi_cxx11_(&local_f10,pVVar12);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_f10);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [4])0x136d034);
        pFVar14 = (FloatFormat *)
                  std::vector<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                  ::operator[]((vector<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                                *)&highpFmt.m_maxValue,(size_type)pVStack_860);
        valueToString<tcu::Matrix<float,2,3>>
                  (&local_f30,(shaderexecutor *)&numErrors,pFVar14,(Matrix<float,_2,_3> *)pIVar15);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_f30);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x1387264);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [18])"\tExpected range: ");
        intervalToString<tcu::Matrix<float,2,3>>
                  (&local_f50,(shaderexecutor *)&numErrors,(FloatFormat *)local_8f8,pIVar15);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_f50);
        tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x1387264);
        std::__cxx11::string::~string((string *)&local_f50);
        std::__cxx11::string::~string((string *)&local_f30);
        std::__cxx11::string::~string((string *)&local_f10);
      }
      if (1 < iVar7) {
        pMVar8 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_df0,(char (*) [2])0x12f6f82);
        pVVar13 = de::SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>::
                  operator->(&(this->m_variables).out1.
                              super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>
                            );
        Variable<vkt::shaderexecutor::Void>::getName_abi_cxx11_(&local_f70,pVVar13);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_f70);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [4])0x136d034);
        pvVar16 = std::vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                  ::operator[]((vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                                *)&outputs.out0.
                                   super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (size_type)pVStack_860);
        valueToString<vkt::shaderexecutor::Void>(&local_f90,(FloatFormat *)&numErrors,pvVar16);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_f90);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x1387264);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [18])"\tExpected range: ");
        intervalToString<vkt::shaderexecutor::Void>(&local_fb0,(FloatFormat *)&numErrors,&local_8f9)
        ;
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_fb0);
        tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x1387264);
        std::__cxx11::string::~string((string *)&local_fb0);
        std::__cxx11::string::~string((string *)&local_f90);
        std::__cxx11::string::~string((string *)&local_f70);
      }
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_df0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_df0);
    }
    tcu::Matrix<tcu::Interval,_2,_3>::~Matrix((Matrix<tcu::Interval,_2,_3> *)local_8f8);
    pVStack_860 = pVStack_860 + 1;
  } while( true );
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}